

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O0

void TrainModel(void)

{
  int iVar1;
  void *__ptr;
  FILE *__stream;
  FILE *__stream_00;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  int *piVar2;
  long lVar3;
  double dVar4;
  real *cent;
  real x;
  real closev;
  int *cl;
  int *centcn;
  int closeid;
  int iter;
  int clcn;
  FILE *fhs;
  pthread_t *pt;
  FILE *fo;
  long d;
  long c;
  long b;
  long a;
  
  __ptr = malloc((long)num_threads << 3);
  if (__ptr == (void *)0x0) {
    fprintf(_stderr,"cannot allocate memory for threads\n");
    exit(1);
  }
  printf("Starting training using file %s\n",train_file);
  starting_alpha = alpha;
  if (read_vocab_file[0] == '\0') {
    LearnVocabFromTrainFile();
  }
  else {
    ReadVocab();
  }
  if (save_vocab_file[0] != '\0') {
    SaveVocab();
  }
  if (output_file[0] != '\0') {
    InitNet();
    if (0 < negative) {
      InitUnigramTable();
    }
    printf("Starting to learn\n");
    start = clock();
    for (b = 0; b < num_threads; b = b + 1) {
      pthread_create((pthread_t *)((long)__ptr + b * 8),(pthread_attr_t *)0x0,TrainModelThread,
                     (void *)b);
    }
    for (b = 0; b < num_threads; b = b + 1) {
      pthread_join(*(pthread_t *)((long)__ptr + b * 8),(void **)0x0);
    }
    __stream = fopen(output_file,"wb");
    if (__stream == (FILE *)0x0) {
      fprintf(_stderr,"Cannot open %s: permission denied\n",output_file);
      exit(1);
    }
    if (classes == 0) {
      fprintf(__stream,"%lld %lld\n",vocab_size,layer1_size);
      for (b = 0; b < vocab_size; b = b + 1) {
        if (vocab[b].word != (char *)0x0) {
          fprintf(__stream,"%s ",vocab[b].word);
        }
        if (binary == 0) {
          for (c = 0; c < layer1_size; c = c + 1) {
            fprintf(__stream,"%lf ",(double)syn0[b * layer1_size + c]);
          }
        }
        else {
          for (c = 0; c < layer1_size; c = c + 1) {
            fwrite(syn0 + b * layer1_size + c,4,1,__stream);
          }
        }
        fprintf(__stream,"\n");
      }
      if (hs != 0) {
        __stream_00 = fopen(output_classifier,"ab");
        for (b = 0; b < vocab_size; b = b + 1) {
          if (binary == 0) {
            for (c = 0; c < layer1_size; c = c + 1) {
              fprintf(__stream_00,"%lf ",(double)syn1[b * layer1_size + c]);
            }
            fprintf(__stream_00,"\n");
          }
          else {
            for (c = 0; c < layer1_size; c = c + 1) {
              fwrite(syn1 + b * layer1_size + c,4,1,__stream_00);
            }
          }
        }
        fclose(__stream_00);
      }
    }
    else {
      iVar1 = (int)classes;
      __ptr_00 = malloc(classes << 2);
      if (__ptr_00 == (void *)0x0) {
        fprintf(_stderr,"cannot allocate memory for centcn\n");
        exit(1);
      }
      __ptr_01 = calloc(vocab_size,4);
      __ptr_02 = calloc(classes * layer1_size,4);
      for (b = 0; b < vocab_size; b = b + 1) {
        *(int *)((long)__ptr_01 + b * 4) = (int)(b % (long)iVar1);
      }
      for (b = 0; b < 10; b = b + 1) {
        for (c = 0; c < iVar1 * layer1_size; c = c + 1) {
          *(undefined4 *)((long)__ptr_02 + c * 4) = 0;
        }
        for (c = 0; c < iVar1; c = c + 1) {
          *(undefined4 *)((long)__ptr_00 + c * 4) = 1;
        }
        for (d = 0; d < vocab_size; d = d + 1) {
          for (fo = (FILE *)0x0; (long)fo < layer1_size; fo = (FILE *)((long)&fo->_flags + 1)) {
            piVar2 = (int *)((long)&fo->_flags + layer1_size * *(int *)((long)__ptr_01 + d * 4));
            *(float *)((long)__ptr_02 + (long)piVar2 * 4) =
                 syn0[(long)((long)&fo->_flags + d * layer1_size)] +
                 *(float *)((long)__ptr_02 + (long)piVar2 * 4);
          }
          lVar3 = (long)*(int *)((long)__ptr_01 + d * 4);
          *(int *)((long)__ptr_00 + lVar3 * 4) = *(int *)((long)__ptr_00 + lVar3 * 4) + 1;
        }
        for (c = 0; c < iVar1; c = c + 1) {
          cent._4_4_ = 0.0;
          for (d = 0; d < layer1_size; d = d + 1) {
            lVar3 = layer1_size * c + d;
            *(float *)((long)__ptr_02 + lVar3 * 4) =
                 *(float *)((long)__ptr_02 + lVar3 * 4) / (float)*(int *)((long)__ptr_00 + c * 4);
            cent._4_4_ = *(float *)((long)__ptr_02 + (layer1_size * c + d) * 4) *
                         *(float *)((long)__ptr_02 + (layer1_size * c + d) * 4) + cent._4_4_;
          }
          dVar4 = sqrt((double)cent._4_4_);
          for (d = 0; d < layer1_size; d = d + 1) {
            lVar3 = layer1_size * c + d;
            *(float *)((long)__ptr_02 + lVar3 * 4) =
                 *(float *)((long)__ptr_02 + lVar3 * 4) / (float)dVar4;
          }
        }
        for (d = 0; d < vocab_size; d = d + 1) {
          cent._4_4_ = -10.0;
          centcn._4_4_ = 0;
          for (fo = (FILE *)0x0; (long)fo < (long)iVar1; fo = (FILE *)((long)&fo->_flags + 1)) {
            cent._0_4_ = 0.0;
            for (c = 0; c < layer1_size; c = c + 1) {
              cent._0_4_ = *(float *)((long)__ptr_02 + (layer1_size * (long)fo + c) * 4) *
                           syn0[d * layer1_size + c] + cent._0_4_;
            }
            if (cent._4_4_ < cent._0_4_) {
              cent._4_4_ = cent._0_4_;
              centcn._4_4_ = SUB84(fo,0);
            }
          }
          *(undefined4 *)((long)__ptr_01 + d * 4) = centcn._4_4_;
        }
      }
      for (b = 0; b < vocab_size; b = b + 1) {
        fprintf(__stream,"%s %d\n",vocab[b].word,(ulong)*(uint *)((long)__ptr_01 + b * 4));
      }
      free(__ptr_00);
      free(__ptr_02);
      free(__ptr_01);
    }
    fclose(__stream);
    free(table);
    free(__ptr);
    DestroyVocab();
  }
  return;
}

Assistant:

void TrainModel() {
  long a, b, c, d;
  FILE *fo;
  pthread_t *pt = (pthread_t *)malloc(num_threads * sizeof(pthread_t));
  if (pt == NULL) {
    fprintf(stderr, "cannot allocate memory for threads\n");
    exit(1);
  }
  printf("Starting training using file %s\n", train_file);
  starting_alpha = alpha;
  if (read_vocab_file[0] != 0) ReadVocab(); else LearnVocabFromTrainFile();
  if (save_vocab_file[0] != 0) SaveVocab();
  if (output_file[0] == 0) return;
  InitNet();
  if (negative > 0) InitUnigramTable();
  printf("Starting to learn\n");
  start = clock();
  for (a = 0; a < num_threads; a++) pthread_create(&pt[a], NULL, TrainModelThread, (void *)a);
  for (a = 0; a < num_threads; a++) pthread_join(pt[a], NULL);
  fo = fopen(output_file, "wb");
  if (fo == NULL) {
    fprintf(stderr, "Cannot open %s: permission denied\n", output_file);
    exit(1);
  }
  if (classes == 0) {
    // Save the word vectors
    fprintf(fo, "%lld %lld\n", vocab_size, layer1_size);
    for (a = 0; a < vocab_size; a++) {
      if (vocab[a].word != NULL) {
        fprintf(fo, "%s ", vocab[a].word);
      }
      if (binary) for (b = 0; b < layer1_size; b++) fwrite(&syn0[a * layer1_size + b], sizeof(real), 1, fo);
      else for (b = 0; b < layer1_size; b++) fprintf(fo, "%lf ", syn0[a * layer1_size + b]);
      fprintf(fo, "\n");
    }

    // Save the classifier
    if (output_classifier && hs) {
      // append to the tree that was already output
      FILE * fhs = fopen(output_classifier, "ab");
      // output the layer
      for (a = 0; a < vocab_size; a++) {
        if (binary) {
          for (b = 0; b < layer1_size; b++) fwrite(&syn1[a * layer1_size + b], sizeof(real), 1, fhs);
        } else {
          for (b = 0; b < layer1_size; b++) fprintf(fhs, "%lf ", syn1[a * layer1_size + b]);
          fprintf(fhs, "\n");
        }
      }
      fclose(fhs);
    }
  } else {
    // Run K-means on the word vectors
    int clcn = classes, iter = 10, closeid;
    int *centcn = (int *)malloc(classes * sizeof(int));
    if (centcn == NULL) {
      fprintf(stderr, "cannot allocate memory for centcn\n");
      exit(1);
    }
    int *cl = (int *)calloc(vocab_size, sizeof(int));
    real closev, x;
    real *cent = (real *)calloc(classes * layer1_size, sizeof(real));
    for (a = 0; a < vocab_size; a++) cl[a] = a % clcn;
    for (a = 0; a < iter; a++) {
      for (b = 0; b < clcn * layer1_size; b++) cent[b] = 0;
      for (b = 0; b < clcn; b++) centcn[b] = 1;
      for (c = 0; c < vocab_size; c++) {
        for (d = 0; d < layer1_size; d++) cent[layer1_size * cl[c] + d] += syn0[c * layer1_size + d];
        centcn[cl[c]]++;
      }
      for (b = 0; b < clcn; b++) {
        closev = 0;
        for (c = 0; c < layer1_size; c++) {
          cent[layer1_size * b + c] /= centcn[b];
          closev += cent[layer1_size * b + c] * cent[layer1_size * b + c];
        }
        closev = sqrt(closev);
        for (c = 0; c < layer1_size; c++) cent[layer1_size * b + c] /= closev;
      }
      for (c = 0; c < vocab_size; c++) {
        closev = -10;
        closeid = 0;
        for (d = 0; d < clcn; d++) {
          x = 0;
          for (b = 0; b < layer1_size; b++) x += cent[layer1_size * d + b] * syn0[c * layer1_size + b];
          if (x > closev) {
            closev = x;
            closeid = d;
          }
        }
        cl[c] = closeid;
      }
    }
    // Save the K-means classes
    for (a = 0; a < vocab_size; a++) fprintf(fo, "%s %d\n", vocab[a].word, cl[a]);
    free(centcn);
    free(cent);
    free(cl);
  }
  fclose(fo);
  free(table);
  free(pt);
  DestroyVocab();
}